

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *prototype)

{
  int iVar1;
  Rep *pRVar2;
  WeightParams *pWVar3;
  int iVar4;
  
  pRVar2 = this->rep_;
  if (pRVar2 == (Rep *)0x0) {
    iVar4 = this->total_size_;
  }
  else {
    iVar1 = this->current_size_;
    iVar4 = pRVar2->allocated_size;
    if (iVar1 < iVar4) {
      this->current_size_ = iVar1 + 1;
      return (Type *)pRVar2->elements[iVar1];
    }
    if (iVar4 != this->total_size_) goto LAB_0015ed64;
  }
  Reserve(this,iVar4 + 1);
  pRVar2 = this->rep_;
  iVar4 = pRVar2->allocated_size;
LAB_0015ed64:
  pRVar2->allocated_size = iVar4 + 1;
  pWVar3 = GenericTypeHandler<CoreML::Specification::WeightParams>::New(this->arena_);
  iVar4 = this->current_size_;
  this->current_size_ = iVar4 + 1;
  this->rep_->elements[iVar4] = pWVar3;
  return pWVar3;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::Add(
    typename TypeHandler::Type* prototype) {
  if (rep_ != NULL && current_size_ < rep_->allocated_size) {
    return cast<TypeHandler>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  typename TypeHandler::Type* result =
      TypeHandler::NewFromPrototype(prototype, arena_);
  rep_->elements[current_size_++] = result;
  return result;
}